

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O2

void t8(void)

{
  uint uVar1;
  int iVar2;
  
  puts("Bank read/write tests.");
  gpio_write(0x19,0);
  uVar1 = read_bank_1();
  CHECK(8,1,uVar1 & 0x2000000,0,0,"read bank 1");
  gpio_write(0x19,1);
  uVar1 = read_bank_1();
  CHECK(8,2,uVar1 & 0x2000000,0x2000000,0,"read bank 1");
  clear_bank_1(0x2000000);
  iVar2 = gpio_read(0x19);
  CHECK(8,3,iVar2,0,0,"clear bank 1");
  set_bank_1(0x2000000);
  iVar2 = gpio_read(0x19);
  CHECK(8,4,iVar2,1,0,"set bank 1");
  iVar2 = read_bank_2();
  CHECK(8,5,(uint)(iVar2 == 0),0,0,"read bank 2");
  iVar2 = clear_bank_2(0);
  CHECK(8,6,iVar2,0,0,"clear bank 2");
  iVar2 = clear_bank_2(0xffffff);
  CHECK(8,7,iVar2,-0x2a,0,"clear bank 2");
  iVar2 = set_bank_2(0);
  CHECK(8,8,iVar2,0,0,"set bank 2");
  iVar2 = set_bank_2(0xffffff);
  CHECK(8,9,iVar2,-0x2a,0,"set bank 2");
  return;
}

Assistant:

void t8()
{
   int v;

   printf("Bank read/write tests.\n");

   gpio_write(GPIO, 0);
   v = read_bank_1() & (1<<GPIO);
   CHECK(8, 1, v, 0, 0, "read bank 1");

   gpio_write(GPIO, 1);
   v = read_bank_1() & (1<<GPIO);
   CHECK(8, 2, v, (1<<GPIO), 0, "read bank 1");

   clear_bank_1(1<<GPIO);
   v = gpio_read(GPIO);
   CHECK(8, 3, v, 0, 0, "clear bank 1");

   set_bank_1(1<<GPIO);
   v = gpio_read(GPIO);
   CHECK(8, 4, v, 1, 0, "set bank 1");

   v = read_bank_2();

   if (v) v = 0; else v = 1;

   CHECK(8, 5, v, 0, 0, "read bank 2");

   v = clear_bank_2(0);
   CHECK(8, 6, v, 0, 0, "clear bank 2");

   v = clear_bank_2(0xffffff);
   CHECK(8, 7, v, PI_SOME_PERMITTED, 0, "clear bank 2");

   v = set_bank_2(0);
   CHECK(8, 8, v, 0, 0, "set bank 2");

   v = set_bank_2(0xffffff);
   CHECK(8, 9, v, PI_SOME_PERMITTED, 0, "set bank 2");
}